

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleGlobCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  pointer pbVar3;
  pointer pbVar4;
  bool bVar5;
  PolicyStatus id;
  int iVar6;
  undefined8 uVar7;
  char *pcVar8;
  long *plVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  ulong uVar11;
  byte bVar12;
  size_type *psVar13;
  undefined7 in_register_00000011;
  pointer pMVar14;
  long lVar15;
  string *inexpr;
  pointer pbVar16;
  bool bVar17;
  string expr;
  string output;
  string variable;
  GlobMessages globMessages;
  Glob g;
  bool local_169;
  string local_168;
  cmCommand *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  char *local_120;
  undefined8 local_118;
  char local_110;
  undefined7 uStack_10f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_100;
  string local_f8;
  undefined4 local_d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined8 local_b0;
  GlobMessages local_a8;
  ulong local_90;
  Glob local_88;
  
  pbVar16 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_148 = &this->super_cmCommand;
  local_100 = args;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16) < 0x21) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmFileCommand.cxx"
                  ,0x2f0,
                  "bool cmFileCommand::HandleGlobCommand(const std::vector<std::string> &, bool)");
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  pcVar1 = pbVar16[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar1,pcVar1 + pbVar16[1]._M_string_length);
  cmsys::Glob::Glob(&local_88);
  local_88.Recurse = recurse;
  id = cmMakefile::GetPolicyStatus(local_148->Makefile,CMP0009);
  pbVar16 = pbVar16 + 2;
  if (id < (REQUIRED_ALWAYS|WARN) && recurse) {
    local_88.RecurseThroughSymlinks = SUB81(0x101L >> ((char)id * '\b' & 0x3fU),0);
  }
  local_120 = &local_110;
  local_118 = 0;
  local_110 = '\0';
  local_169 = pbVar16 ==
              (local_100->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (local_169) {
    bVar12 = 0;
  }
  else {
    local_d4 = (undefined4)CONCAT71(in_register_00000011,recurse);
    bVar17 = true;
    local_b0 = 0;
    local_90 = (ulong)id;
    do {
      iVar6 = std::__cxx11::string::compare((char *)pbVar16);
      if (iVar6 == 0) {
        pbVar16 = pbVar16 + 1;
        if (pbVar16 ==
            (local_100->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_168,"LIST_DIRECTORIES missing bool value.","");
          cmCommand::SetError(local_148,&local_168);
          goto LAB_0032715d;
        }
        bVar5 = cmSystemTools::IsOn((pbVar16->_M_dataplus)._M_p);
        if (bVar5) {
          local_88.ListDirs = true;
          local_88.RecurseListDirs = true;
        }
        else {
          bVar5 = cmSystemTools::IsOff((pbVar16->_M_dataplus)._M_p);
          if (!bVar5) {
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_168,"LIST_DIRECTORIES missing bool value.","");
            cmCommand::SetError(local_148,&local_168);
            goto LAB_0032715d;
          }
          local_88.ListDirs = false;
          local_88.RecurseListDirs = false;
        }
      }
      else {
        if (((char)local_d4 != '\0') &&
           (uVar7 = std::__cxx11::string::compare((char *)pbVar16), (int)uVar7 == 0)) {
          local_88.RecurseThroughSymlinks = true;
          pbVar16 = pbVar16 + 1;
          local_b0 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
          if (pbVar16 ==
              (local_100->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_168,
                       "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS","");
            cmCommand::SetError(local_148,&local_168);
            goto LAB_0032715d;
          }
        }
        iVar6 = std::__cxx11::string::compare((char *)pbVar16);
        if (iVar6 == 0) {
          if (pbVar16 + 1 ==
              (local_100->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_168,"GLOB requires a directory after the RELATIVE tag","");
            cmCommand::SetError(local_148,&local_168);
          }
          else {
            cmsys::Glob::SetRelative(&local_88,pbVar16[1]._M_dataplus._M_p);
            pbVar16 = pbVar16 + 2;
            if (pbVar16 !=
                (local_100->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00326b03;
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_168,"GLOB requires a glob expression after the directory",""
                      );
            cmCommand::SetError(local_148,&local_168);
          }
LAB_0032715d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00327179;
        }
LAB_00326b03:
        local_a8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar5 = cmsys::SystemTools::FileIsFullPath((pbVar16->_M_dataplus)._M_p);
        if (bVar5) {
          cmsys::Glob::FindFiles(&local_88,pbVar16,&local_a8);
        }
        else {
          pcVar8 = cmMakefile::GetCurrentSourceDirectory(local_148->Makefile);
          std::__cxx11::string::string((string *)&local_168,pcVar8,(allocator *)&local_140);
          inexpr = pbVar16;
          if (local_168._M_string_length != 0) {
            std::operator+(&local_140,"/",pbVar16);
            std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_140._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1
                             );
            }
            inexpr = &local_168;
          }
          cmsys::Glob::FindFiles(&local_88,inexpr,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_a8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_a8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00326ed4:
          pvVar10 = cmsys::Glob::GetFiles_abi_cxx11_(&local_88);
          pbVar3 = (pvVar10->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pbVar4 = (pvVar10->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar3 != pbVar4) {
            uVar11 = (long)pbVar4 - (long)pbVar3 >> 5;
            lVar15 = 0x3f;
            if (uVar11 != 0) {
              for (; uVar11 >> lVar15 == 0; lVar15 = lVar15 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (pbVar3,pbVar4,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (pbVar3,pbVar4);
          }
          bVar5 = true;
          if ((pvVar10->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish !=
              (pvVar10->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
            lVar15 = 8;
            uVar11 = 0;
            do {
              if (!bVar17) {
                std::__cxx11::string::append((char *)&local_120);
              }
              std::__cxx11::string::_M_append
                        ((char *)&local_120,
                         *(ulong *)((long)(pvVar10->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + lVar15 + -8))
              ;
              uVar11 = uVar11 + 1;
              lVar15 = lVar15 + 0x20;
              bVar17 = false;
            } while (uVar11 < (ulong)((long)(pvVar10->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pvVar10->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start >> 5));
          }
        }
        else {
          bVar5 = false;
          pMVar14 = local_a8.
                    super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar2 = local_148->Makefile;
            if (pMVar14->type == cyclicRecursion) {
              std::operator+(&local_d0,"Cyclic recursion detected while globbing for \'",pbVar16);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              psVar13 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_140.field_2._M_allocated_capacity = *psVar13;
                local_140.field_2._8_8_ = plVar9[3];
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar13;
                local_140._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_140._M_string_length = plVar9[1];
              *plVar9 = (long)psVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_140,
                                          (ulong)(pMVar14->content)._M_dataplus._M_p);
              local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              psVar13 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_168.field_2._M_allocated_capacity = *psVar13;
                local_168.field_2._8_8_ = plVar9[3];
              }
              else {
                local_168.field_2._M_allocated_capacity = *psVar13;
                local_168._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_168._M_string_length = plVar9[1];
              *plVar9 = (long)psVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_168);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              std::operator+(&local_d0,"Error has occurred while globbing for \'",pbVar16);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              psVar13 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_140.field_2._M_allocated_capacity = *psVar13;
                local_140.field_2._8_8_ = plVar9[3];
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar13;
                local_140._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_140._M_string_length = plVar9[1];
              *plVar9 = (long)psVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_140,
                                          (ulong)(pMVar14->content)._M_dataplus._M_p);
              local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              psVar13 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_168.field_2._M_allocated_capacity = *psVar13;
                local_168.field_2._8_8_ = plVar9[3];
              }
              else {
                local_168.field_2._M_allocated_capacity = *psVar13;
                local_168._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_168._M_string_length = plVar9[1];
              *plVar9 = (long)psVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_168);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
              bVar5 = true;
            }
            pMVar14 = pMVar14 + 1;
          } while (pMVar14 !=
                   local_a8.
                   super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
          if (!bVar5) goto LAB_00326ed4;
          bVar5 = false;
        }
        std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector(&local_a8)
        ;
        if (!bVar5) goto LAB_00327179;
      }
      pbVar16 = pbVar16 + 1;
      local_169 = pbVar16 ==
                  (local_100->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    } while (!local_169);
    recurse = SUB41(local_d4,0);
    id = (PolicyStatus)local_90;
    bVar12 = (byte)local_b0;
  }
  if (((recurse != false) && (id < NEW && (bVar12 & 1) == 0)) &&
     (local_88.FollowedSymlinkCount != 0)) {
    pcVar2 = local_148->Makefile;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_168,(cmPolicies *)0x9,id);
    cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
  }
  cmMakefile::AddDefinition(local_148->Makefile,&local_f8,local_120);
LAB_00327179:
  if (local_120 != &local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  cmsys::Glob::~Glob(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return local_169;
}

Assistant:

bool cmFileCommand::HandleGlobCommand(std::vector<std::string> const& args,
                                      bool recurse)
{
  // File commands has at least one argument
  assert(args.size() > 1);

  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string variable = *i;
  i++;
  cmsys::Glob g;
  g.SetRecurse(recurse);

  bool explicitFollowSymlinks = false;
  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0009);
  if (recurse) {
    switch (status) {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        g.RecurseThroughSymlinksOff();
        break;
      case cmPolicies::OLD:
      case cmPolicies::WARN:
        g.RecurseThroughSymlinksOn();
        break;
    }
  }

  std::string output;
  bool first = true;
  for (; i != args.end(); ++i) {
    if (*i == "LIST_DIRECTORIES") {
      ++i;
      if (i != args.end()) {
        if (cmSystemTools::IsOn(i->c_str())) {
          g.SetListDirs(true);
          g.SetRecurseListDirs(true);
        } else if (cmSystemTools::IsOff(i->c_str())) {
          g.SetListDirs(false);
          g.SetRecurseListDirs(false);
        } else {
          this->SetError("LIST_DIRECTORIES missing bool value.");
          return false;
        }
      } else {
        this->SetError("LIST_DIRECTORIES missing bool value.");
        return false;
      }
      continue;
    }

    if (recurse && (*i == "FOLLOW_SYMLINKS")) {
      explicitFollowSymlinks = true;
      g.RecurseThroughSymlinksOn();
      ++i;
      if (i == args.end()) {
        this->SetError(
          "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS");
        return false;
      }
    }

    if (*i == "RELATIVE") {
      ++i; // skip RELATIVE
      if (i == args.end()) {
        this->SetError("GLOB requires a directory after the RELATIVE tag");
        return false;
      }
      g.SetRelative(i->c_str());
      ++i;
      if (i == args.end()) {
        this->SetError("GLOB requires a glob expression after the directory");
        return false;
      }
    }

    cmsys::Glob::GlobMessages globMessages;
    if (!cmsys::SystemTools::FileIsFullPath(i->c_str())) {
      std::string expr = this->Makefile->GetCurrentSourceDirectory();
      // Handle script mode
      if (!expr.empty()) {
        expr += "/" + *i;
        g.FindFiles(expr, &globMessages);
      } else {
        g.FindFiles(*i, &globMessages);
      }
    } else {
      g.FindFiles(*i, &globMessages);
    }

    if (!globMessages.empty()) {
      bool shouldExit = false;
      for (cmsys::Glob::GlobMessagesIterator it = globMessages.begin();
           it != globMessages.end(); ++it) {
        if (it->type == cmsys::Glob::cyclicRecursion) {
          this->Makefile->IssueMessage(
            cmake::AUTHOR_WARNING,
            "Cyclic recursion detected while globbing for '" + *i + "':\n" +
              it->content);
        } else {
          this->Makefile->IssueMessage(
            cmake::FATAL_ERROR, "Error has occurred while globbing for '" +
              *i + "' - " + it->content);
          shouldExit = true;
        }
      }
      if (shouldExit) {
        return false;
      }
    }

    std::vector<std::string>::size_type cc;
    std::vector<std::string>& files = g.GetFiles();
    std::sort(files.begin(), files.end());
    for (cc = 0; cc < files.size(); cc++) {
      if (!first) {
        output += ";";
      }
      output += files[cc];
      first = false;
    }
  }

  if (recurse && !explicitFollowSymlinks) {
    switch (status) {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // Correct behavior, yay!
        break;
      case cmPolicies::OLD:
      // Probably not really the expected behavior, but the author explicitly
      // asked for the old behavior... no warning.
      case cmPolicies::WARN:
        // Possibly unexpected old behavior *and* we actually traversed
        // symlinks without being explicitly asked to: warn the author.
        if (g.GetFollowedSymlinkCount() != 0) {
          this->Makefile->IssueMessage(
            cmake::AUTHOR_WARNING,
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0009));
        }
        break;
    }
  }

  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}